

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O0

void ver_boundary_overlap
               (int *left_block,int left_stride,int *right_block,int right_stride,int *dst_block,
               int dst_stride,int width,int height)

{
  int iVar1;
  int in_ECX;
  int *in_RDX;
  int in_ESI;
  int *in_RDI;
  int *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int *local_28;
  int *local_18;
  int *local_8;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (in_stack_00000008 == 1) {
    while ((int)dst_block != 0) {
      iVar1 = clamp(*local_8 * 0x17 + *local_18 * 0x16 + 0x10 >> 5,grain_min,grain_max);
      *local_28 = iVar1;
      local_8 = local_8 + in_ESI;
      local_18 = local_18 + in_ECX;
      local_28 = local_28 + in_R9D;
      dst_block = (int *)(ulong)((int)dst_block - 1);
    }
  }
  else if (in_stack_00000008 == 2) {
    while ((int)dst_block != 0) {
      iVar1 = clamp(*local_8 * 0x1b + *local_18 * 0x11 + 0x10 >> 5,grain_min,grain_max);
      *local_28 = iVar1;
      iVar1 = clamp(local_8[1] * 0x11 + local_18[1] * 0x1b + 0x10 >> 5,grain_min,grain_max);
      local_28[1] = iVar1;
      local_8 = local_8 + in_ESI;
      local_18 = local_18 + in_ECX;
      local_28 = local_28 + in_R9D;
      dst_block = (int *)(ulong)((int)dst_block - 1);
    }
  }
  return;
}

Assistant:

static void ver_boundary_overlap(int *left_block, int left_stride,
                                 int *right_block, int right_stride,
                                 int *dst_block, int dst_stride, int width,
                                 int height) {
  if (width == 1) {
    while (height) {
      *dst_block = clamp((*left_block * 23 + *right_block * 22 + 16) >> 5,
                         grain_min, grain_max);
      left_block += left_stride;
      right_block += right_stride;
      dst_block += dst_stride;
      --height;
    }
    return;
  } else if (width == 2) {
    while (height) {
      dst_block[0] = clamp((27 * left_block[0] + 17 * right_block[0] + 16) >> 5,
                           grain_min, grain_max);
      dst_block[1] = clamp((17 * left_block[1] + 27 * right_block[1] + 16) >> 5,
                           grain_min, grain_max);
      left_block += left_stride;
      right_block += right_stride;
      dst_block += dst_stride;
      --height;
    }
    return;
  }
}